

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

void __thiscall QGraphicsWidget::setFont(QGraphicsWidget *this,QFont *font)

{
  QGraphicsWidgetPrivate *this_00;
  QGraphicsWidgetPrivate *d;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  _func_int **local_38;
  Data *pDStack_30;
  ExtraStruct *local_28;
  
  local_28 = *(ExtraStruct **)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
  *(ushort *)&this_00->field_0x1b4 =
       (ushort)(*(int *)(font + 8) != 0) << 8 |
       (ushort)*(undefined4 *)&this_00->field_0x1b4 & 0xfeff;
  local_38 = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  pDStack_30 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QGraphicsWidgetPrivate::naturalWidgetFont((QGraphicsWidgetPrivate *)&stack0xffffffffffffffc8);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::resolve((QFont *)&local_48);
  QGraphicsWidgetPrivate::setFont_helper(this_00,(QFont *)&local_48);
  QFont::~QFont((QFont *)&local_48);
  QFont::~QFont((QFont *)&stack0xffffffffffffffc8);
  if (*(ExtraStruct **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::setFont(const QFont &font)
{
    Q_D(QGraphicsWidget);
    setAttribute(Qt::WA_SetFont, font.resolveMask() != 0);

    QFont naturalFont = d->naturalWidgetFont();
    QFont resolvedFont = font.resolve(naturalFont);
    d->setFont_helper(resolvedFont);
}